

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

RegSlot __thiscall ByteCodeGenerator::AssignUndefinedConstRegister(ByteCodeGenerator *this)

{
  FuncInfo *this_00;
  RegSlot RVar1;
  Type *ppFVar2;
  
  ppFVar2 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this->funcInfoStack->
                        super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  this_00 = *ppFVar2;
  RVar1 = this_00->undefinedConstantRegister;
  if (RVar1 == 0xffffffff) {
    RVar1 = FuncInfo::NextConstRegister(this_00);
    this_00->undefinedConstantRegister = RVar1;
  }
  return RVar1;
}

Assistant:

Js::RegSlot ByteCodeGenerator::AssignUndefinedConstRegister()
{
    FuncInfo *top = funcInfoStack->Top();
    return top->AssignUndefinedConstRegister();
}